

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

bool __thiscall QPDFAcroFormDocumentHelper::getNeedAppearances(QPDFAcroFormDocumentHelper *this)

{
  byte bVar1;
  bool bVar2;
  bool local_ea;
  allocator<char> local_d9;
  string local_d8 [32];
  QPDFObjectHandle local_b8;
  byte local_a4;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0 [32];
  QPDFObjectHandle local_80 [2];
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [24];
  QPDFObjectHandle acroform;
  bool result;
  QPDFAcroFormDocumentHelper *this_local;
  
  acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  QPDF::getRoot((QPDF *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/AcroForm",&local_59);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_38 + 0x10),(string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  local_a2 = 0;
  local_a3 = 0;
  local_a4 = 0;
  bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_38 + 0x10));
  local_ea = false;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"/NeedAppearances",&local_a1);
    local_a3 = 1;
    QPDFObjectHandle::getKey(local_80,(string *)(local_38 + 0x10));
    local_a4 = 1;
    local_ea = QPDFObjectHandle::isBool(local_80);
  }
  if ((local_a4 & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(local_80);
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string(local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a1);
  }
  if (local_ea != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d8,"/NeedAppearances",&local_d9);
    QPDFObjectHandle::getKey(&local_b8,(string *)(local_38 + 0x10));
    acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = QPDFObjectHandle::getBoolValue(&local_b8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_b8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
  }
  bVar1 = acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._7_1_;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_38 + 0x10));
  return (bool)(bVar1 & 1);
}

Assistant:

bool
QPDFAcroFormDocumentHelper::getNeedAppearances()
{
    bool result = false;
    QPDFObjectHandle acroform = qpdf.getRoot().getKey("/AcroForm");
    if (acroform.isDictionary() && acroform.getKey("/NeedAppearances").isBool()) {
        result = acroform.getKey("/NeedAppearances").getBoolValue();
    }
    return result;
}